

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# measunit.cpp
# Opt level: O2

int32_t icu_63::binarySearch(char **array,int32_t start,int32_t end,char *key)

{
  int iVar1;
  int iVar2;
  
  do {
    while( true ) {
      if (end <= start) {
        return -1;
      }
      iVar1 = (start + end) / 2;
      iVar2 = strcmp(array[iVar1],key);
      if (-1 < iVar2) break;
      start = iVar1 + 1;
    }
    end = iVar1;
  } while (iVar2 != 0);
  return iVar1;
}

Assistant:

static int32_t binarySearch(
        const char * const * array, int32_t start, int32_t end, const char * key) {
    while (start < end) {
        int32_t mid = (start + end) / 2;
        int32_t cmp = uprv_strcmp(array[mid], key);
        if (cmp < 0) {
            start = mid + 1;
            continue;
        }
        if (cmp == 0) {
            return mid;
        }
        end = mid;
    }
    return -1;
}